

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_gen.cc
# Opt level: O2

bool google::protobuf::internal::IsFieldTypeEligibleForFastParsing(FieldDescriptor *field)

{
  bool bVar1;
  CppStringType CVar2;
  OneofDescriptor *pOVar3;
  
  bVar1 = FieldDescriptor::is_map(field);
  if ((((bVar1) ||
       (pOVar3 = FieldDescriptor::real_containing_oneof(field), pOVar3 != (OneofDescriptor *)0x0))
      || ((field->options_->field_0)._impl_.weak_ != false)) ||
     (((field->type_ == '\f' || (field->type_ == '\t')) &&
      ((CVar2 = FieldDescriptor::cpp_string_type(field), (CVar2 & ~kCord) != kView &&
       ((CVar2 != kCord || (bVar1 = FieldDescriptor::is_repeated(field), bVar1)))))))) {
    bVar1 = false;
  }
  else {
    bVar1 = field->number_ < 0x800;
  }
  return bVar1;
}

Assistant:

bool IsFieldTypeEligibleForFastParsing(const FieldDescriptor* field) {
  // Map, oneof, weak, and split fields are not handled on the fast path.
  if (field->is_map() || field->real_containing_oneof() ||
      field->options().weak()) {
    return false;
  }

  switch (field->type()) {
      // Some bytes fields can be handled on fast path.
    case FieldDescriptor::TYPE_STRING:
    case FieldDescriptor::TYPE_BYTES: {
      auto ctype = field->cpp_string_type();
      if (ctype == FieldDescriptor::CppStringType::kString ||
          ctype == FieldDescriptor::CppStringType::kView) {
        // strings are fine...
      } else if (ctype == FieldDescriptor::CppStringType::kCord) {
        // Cords are worth putting into the fast table, if they're not repeated
        if (field->is_repeated()) return false;
      } else {
        return false;
      }
      break;
    }

    default:
      break;
  }

  // The largest tag that can be read by the tailcall parser is two bytes
  // when varint-coded. This allows 14 bits for the numeric tag value:
  //   byte 0   byte 1
  //   1nnnnttt 0nnnnnnn
  //    ^^^^^^^  ^^^^^^^
  if (field->number() >= 1 << 11) return false;

  return true;
}